

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::usda::USDAReader::Impl::GetAsLayer(Impl *this,Layer *layer)

{
  string *err;
  ulong *puVar1;
  ulong primSpecIdx;
  bool bVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar4;
  char *pcVar5;
  ulong *puVar6;
  pointer pPVar7;
  string *name;
  bool bVar8;
  ostringstream ss_e;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"GetAsLayer",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x56b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar5 = "layer arg is nullptr.";
    lVar4 = 0x15;
  }
  else {
    if (this->_primspec_invalidated != true) {
      ::std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>_>_>
      ::_M_deallocate_nodes
                ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>_>_>
                  *)&layer->_prim_specs,(__node_ptr)(layer->_prim_specs)._M_h._M_before_begin._M_nxt
                );
      memset((layer->_prim_specs)._M_h._M_buckets,0,(layer->_prim_specs)._M_h._M_bucket_count << 3);
      (layer->_prim_specs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (layer->_prim_specs)._M_h._M_element_count = 0;
      LayerMetas::operator=(&layer->_metas,&(this->_stage).stage_metas);
      puVar6 = (this->_toplevel_primspecs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = (this->_toplevel_primspecs).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar8 = puVar6 == puVar1;
      if (!bVar8) {
        err = &this->_err;
        do {
          primSpecIdx = *puVar6;
          pPVar7 = (this->_primspec_nodes).
                   super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this->_primspec_nodes).
                             super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >> 3) *
                     0x6fe99e1395aedd07) <= primSpecIdx) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"GetAsLayer",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x57a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            pcVar5 = "[Internal Error] out-of-bounds access.";
            lVar4 = 0x26;
LAB_00131a0f:
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_00131a5b:
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
LAB_00131a68:
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            ::std::ios_base::~ios_base(local_138);
            if (!bVar8) {
              return false;
            }
            break;
          }
          pPVar7 = pPVar7 + primSpecIdx;
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err;
          bVar2 = anon_unknown_1::ToPrimSpecRec
                            (primSpecIdx,&this->_primspec_nodes,&pPVar7->primSpec,err);
          if (!bVar2) {
            this->_primspec_invalidated = true;
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"GetAsLayer",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x586);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            pcVar5 = "Construct PrimSpec tree failed.";
            lVar4 = 0x1f;
            goto LAB_00131a0f;
          }
          name = &(pPVar7->primSpec)._name;
          bVar2 = Layer::emplace_primspec
                            (layer,name,
                             &(this->_primspec_nodes).
                              super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                              ._M_impl.super__Vector_impl_data._M_start[*puVar6].primSpec);
          if (!bVar2) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"GetAsLayer",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x58a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            local_1c8[0] = local_1b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"Construct PrimSpec tree failed: PrimSpec.name = {}","");
            fmt::format<std::__cxx11::string>(&local_1e8,(fmt *)local_1c8,(string *)name,args);
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                                local_1e8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1e8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) goto LAB_00131a5b;
            goto LAB_00131a68;
          }
          puVar6 = puVar6 + 1;
          bVar8 = puVar6 == puVar1;
        } while (!bVar8);
      }
      this->_primspec_invalidated = true;
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"GetAsLayer",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x56f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar5 = 
    "PrimSpec data is invalid. USD data is not loaded or there was an error in earlier GetAsLayer call, or GetAsLayer was invoked multiple times."
    ;
    lVar4 = 0x8c;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,lVar4);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool USDAReader::Impl::GetAsLayer(Layer *layer) {

  if (!layer) {
    PUSH_ERROR_AND_RETURN("layer arg is nullptr.");
  }

  if (_primspec_invalidated) {
    PUSH_ERROR_AND_RETURN("PrimSpec data is invalid. USD data is not loaded or there was an error in earlier GetAsLayer call, or GetAsLayer was invoked multiple times.");
  }

  layer->clear_primspecs();
  DCOUT("# of subLayers = " << _stage.metas().subLayers.size());
  layer->metas() = _stage.metas();

  for (const auto &idx : _toplevel_primspecs) {
    DCOUT("Toplevel primspec idx: " << std::to_string(idx));

    if (idx >= _primspec_nodes.size()) {
      PUSH_ERROR_AND_RETURN("[Internal Error] out-of-bounds access.");
    }

    auto &node = _primspec_nodes[idx];
    PrimSpec &primSpec = node.primSpec;

    DCOUT("primspec[" << idx << "].typeName = " << primSpec.typeName());
    DCOUT("primspec[" << idx << "].name = " << primSpec.name());
    DCOUT("root prim[" << idx << "].num_children = " << primSpec.children().size());

    if (!ToPrimSpecRec(idx, _primspec_nodes, /* inout */primSpec, &_err)) {
      _primspec_invalidated = true;
      PUSH_ERROR_AND_RETURN("Construct PrimSpec tree failed.");
    }

    if (!layer->emplace_primspec(primSpec.name(), std::move(_primspec_nodes[idx].primSpec))) {
      PUSH_ERROR_AND_RETURN(fmt::format("Construct PrimSpec tree failed: PrimSpec.name = {}", primSpec.name()));
    }
  }

  // NOTE: _toplevel_primspecs are destroyed(std::move'ed)
  _primspec_invalidated = true;

  return true;
}